

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseSourceName(State *state)

{
  bool bVar1;
  int local_4c;
  undefined1 local_48 [4];
  int length;
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(local_48,state,0x30);
  local_4c = -1;
  bVar1 = ParseNumber((State *)copy._40_8_,&local_4c);
  if ((bVar1) && (bVar1 = ParseIdentifier((State *)copy._40_8_,local_4c), bVar1)) {
    state_local._7_1_ = true;
  }
  else {
    memcpy((void *)copy._40_8_,local_48,0x30);
    state_local._7_1_ = false;
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseSourceName(State *state) {
  State copy = *state;
  int length = -1;
  if (ParseNumber(state, &length) && ParseIdentifier(state, length)) {
    return true;
  }
  *state = copy;
  return false;
}